

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab10.c
# Opt level: O0

int CheckerBigTriangle(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  int local_58;
  int passed;
  int j;
  TPoint point;
  int i;
  int foundCount;
  int found [3];
  TPoint pointOut [3];
  FILE *out;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    out._4_4_ = 0xffffffff;
  }
  else {
    found[1] = -0x80000000;
    found[2] = -0x80000000;
    memset(&i,0,0xc);
    point.y = 0;
    for (point.x = 0; point.x < 3; point.x = point.x + 1) {
      memset(&passed,0,8);
      pcVar2 = ScanPoint((FILE *)__stream,(TPoint *)&passed);
      if (pcVar2 == "FAILED") {
        fclose(__stream);
        printf("short output -- %s\n","FAILED");
        return 1;
      }
      for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
        if ((passed == pointOut[(long)local_58 + -1].x) && (j == pointOut[(long)local_58 + -1].y)) {
          if ((&i)[local_58] == 1) {
            fclose(__stream);
            printf("wrong output -- %s\n","FAILED");
            return 1;
          }
          (&i)[local_58] = (&i)[local_58] + 1;
          point.y = point.y + 1;
          break;
        }
      }
    }
    if (point.y == 3) {
      iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
      bigTrianglesN = bigTrianglesN + 1;
      fclose(__stream);
      pcVar2 = "FAILED";
      if (iVar1 == 0) {
        pcVar2 = "PASSED";
      }
      printf("%s\n",pcVar2);
      out._4_4_ = (uint)((iVar1 == 0 ^ 0xffU) & 1);
    }
    else {
      fclose(__stream);
      printf("wrong output -- %s\n","FAILED");
      out._4_4_ = 1;
    }
  }
  return out._4_4_;
}

Assistant:

static int CheckerBigTriangle(void)
{
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        return -1;
    }

    TPoint pointOut[3] =  { { INT_MIN, INT_MIN }, { INT_MAX, INT_MAX }, { INT_MAX, INT_MAX } };
    if (bigTrianglesN == 1) {
        pointOut[2].y = INT_MAX - MAX_POINT_COUNT + 2;
    }
    else if (bigTrianglesN == 2) {
        pointOut[2].x = INT_MAX - MAX_POINT_COUNT + 2;
    } 

    int found[3] = { 0 };
    int foundCount = 0;
    for (int i = 0; i < 3; ++i) {
        TPoint point = { 0, 0 };
        if (ScanPoint(out, &point) == Fail) {
            fclose(out);
            printf("short output -- %s\n", Fail);
            return 1;
        }

        for (int j = 0; j < 3; ++j) {
            if (point.x == pointOut[j].x && point.y == pointOut[j].y) {
                if (found[j] == 1) {
                    fclose(out);
                    printf("wrong output -- %s\n", Fail);
                    return 1;
                }
                
                ++found[j];
                ++foundCount;
                break;
            }
        }
    }
    
    if (foundCount != 3) {
        fclose(out);
        printf("wrong output -- %s\n", Fail);
        return 1;
    }

    int passed = !HaveGarbageAtTheEnd(out);

    ++bigTrianglesN;
    fclose(out);
    printf("%s\n", (passed) ? Pass : Fail);
    return !passed;
}